

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void ycck_cmyk_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                      JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  JSAMPLE *pJVar4;
  jpeg_color_deconverter *pjVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  JSAMPROW pJVar13;
  JSAMPROW pJVar14;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  uint local_6c;
  JSAMPARRAY local_68;
  
  if (0 < num_rows) {
    pJVar4 = cinfo->sample_range_limit;
    pjVar5 = cinfo->cconvert;
    p_Var6 = pjVar5[1].start_pass;
    p_Var7 = pjVar5[1].color_convert;
    p_Var8 = pjVar5[2].start_pass;
    p_Var9 = pjVar5[2].color_convert;
    uVar3 = cinfo->output_width;
    local_6c = input_row;
    local_68 = output_buf;
    do {
      if ((ulong)uVar3 != 0) {
        uVar17 = (ulong)local_6c;
        pJVar10 = (*input_buf)[uVar17];
        pJVar11 = input_buf[1][uVar17];
        pJVar12 = input_buf[2][uVar17];
        pJVar13 = input_buf[3][uVar17];
        pJVar14 = *local_68;
        uVar17 = 0;
        do {
          bVar1 = pJVar11[uVar17];
          bVar2 = pJVar12[uVar17];
          uVar16 = pJVar10[uVar17] ^ 0xff;
          pJVar14[uVar17 * 4] = pJVar4[(int)(uVar16 - *(int *)(p_Var6 + (ulong)bVar2 * 4))];
          pJVar14[uVar17 * 4 + 1] =
               pJVar4[(int)(uVar16 - (int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                                  *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10))];
          pJVar14[uVar17 * 4 + 2] = pJVar4[(int)(uVar16 - *(int *)(p_Var7 + (ulong)bVar1 * 4))];
          pJVar14[uVar17 * 4 + 3] = pJVar13[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar3 != uVar17);
      }
      local_6c = local_6c + 1;
      local_68 = local_68 + 1;
      bVar15 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar15);
  }
  return;
}

Assistant:

METHODDEF(void)
ycck_cmyk_convert (j_decompress_ptr cinfo,
		   JSAMPIMAGE input_buf, JDIMENSION input_row,
		   JSAMPARRAY output_buf, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int y, cb, cr;
  register JSAMPROW outptr;
  register JSAMPROW inptr0, inptr1, inptr2, inptr3;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  register int * Crrtab = cconvert->Cr_r_tab;
  register int * Cbbtab = cconvert->Cb_b_tab;
  register INT32 * Crgtab = cconvert->Cr_g_tab;
  register INT32 * Cbgtab = cconvert->Cb_g_tab;
  SHIFT_TEMPS

  while (--num_rows >= 0) {
    inptr0 = input_buf[0][input_row];
    inptr1 = input_buf[1][input_row];
    inptr2 = input_buf[2][input_row];
    inptr3 = input_buf[3][input_row];
    input_row++;
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      y  = GETJSAMPLE(inptr0[col]);
      cb = GETJSAMPLE(inptr1[col]);
      cr = GETJSAMPLE(inptr2[col]);
      /* Range-limiting is essential due to noise introduced by DCT losses. */
      outptr[0] = range_limit[MAXJSAMPLE - (y + Crrtab[cr])];	/* red */
      outptr[1] = range_limit[MAXJSAMPLE - (y +			/* green */
			      ((int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr],
						 SCALEBITS)))];
      outptr[2] = range_limit[MAXJSAMPLE - (y + Cbbtab[cb])];	/* blue */
      /* K passes through unchanged */
      outptr[3] = inptr3[col];	/* don't need GETJSAMPLE here */
      outptr += 4;
    }
  }
}